

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::BlendConstantsTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::BlendConstantsTestInstance>
               *this,Context *context)

{
  char *vertexShaderName;
  DynamicStateBaseClass *this_00;
  mapped_type *ppcVar1;
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_01;
  RGBA local_9c;
  undefined1 local_98 [24];
  Vec4 local_80;
  PositionColorVertex local_70;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_50;
  
  this_00 = (DynamicStateBaseClass *)operator_new(0x1a8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_50,&(this->m_shaderPaths)._M_t);
  local_70.position.m_data[0] = 0.0;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_50,(key_type *)&local_70);
  vertexShaderName = *ppcVar1;
  local_98._0_4_ = 1.4013e-45;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_50,(key_type *)local_98);
  DynamicStateBaseClass::DynamicStateBaseClass(this_00,context,vertexShaderName,*ppcVar1);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DynamicStateBaseClass_00bd5b58;
  this_00->m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  local_98._0_4_ = -1.0;
  local_98._4_4_ = 1.0;
  local_98._8_8_ = &DAT_3f8000003f800000;
  local_9c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_9c);
  PositionColorVertex::PositionColorVertex(&local_70,(Vec4 *)local_98,&local_80);
  this_01 = &this_00->m_data;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_70);
  local_98._0_8_ = &DAT_3f8000003f800000;
  local_98._8_8_ = &DAT_3f8000003f800000;
  local_9c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_9c);
  PositionColorVertex::PositionColorVertex(&local_70,(Vec4 *)local_98,&local_80);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_70);
  local_98._0_4_ = -1.0;
  local_98._4_4_ = -1.0;
  local_98._8_8_ = &DAT_3f8000003f800000;
  local_9c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_9c);
  PositionColorVertex::PositionColorVertex(&local_70,(Vec4 *)local_98,&local_80);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_70);
  local_98._0_4_ = 1.0;
  local_98._4_4_ = -1.0;
  local_98._8_8_ = &DAT_3f8000003f800000;
  local_9c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_9c);
  PositionColorVertex::PositionColorVertex(&local_70,(Vec4 *)local_98,&local_80);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_70);
  DynamicStateBaseClass::initialize(this_00);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_50);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}